

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

void serial_synchronize(Emulator *e)

{
  Ticks TVar1;
  bool bVar2;
  Ticks cpu_tick;
  Ticks delta_ticks;
  Emulator *e_local;
  
  if ((e->state).serial.sync_ticks < (e->state).ticks) {
    cpu_tick = (e->state).ticks - (e->state).serial.sync_ticks;
    bVar2 = false;
    if ((e->state).serial.transferring != FALSE) {
      bVar2 = (e->state).serial.clock == SERIAL_CLOCK_INTERNAL;
    }
    if (bVar2) {
      TVar1 = (e->state).cpu_tick;
      for (; cpu_tick != 0; cpu_tick = cpu_tick - TVar1) {
        (e->state).serial.tick_count = TVar1 + (e->state).serial.tick_count;
        if ((e->state).serial.tick_count < 0x200) {
          bVar2 = false;
          if ((e->state).serial.tick_count == 0) {
            bVar2 = (e->state).serial.transferred_bits == '\0';
          }
          if (bVar2) {
            (e->state).interrupt.if_ = (e->state).interrupt.if_ | (e->state).interrupt.new_if & 8;
          }
        }
        else {
          (e->state).serial.tick_count = (e->state).serial.tick_count - 0x200;
          (e->state).serial.sb = (e->state).serial.sb << 1 | 1;
          (e->state).serial.transferred_bits = (e->state).serial.transferred_bits + '\x01';
          if (7 < (e->state).serial.transferred_bits) {
            (e->state).serial.transferred_bits = (e->state).serial.transferred_bits + 0xf8;
            (e->state).serial.transferring = FALSE;
            (e->state).interrupt.new_if = (e->state).interrupt.new_if | 8;
            (e->state).serial.sync_ticks = (e->state).ticks - cpu_tick;
            calculate_next_serial_intr(e);
          }
        }
      }
    }
    (e->state).serial.sync_ticks = (e->state).ticks;
  }
  return;
}

Assistant:

static void serial_synchronize(Emulator* e) {
  if (TICKS > SERIAL.sync_ticks) {
    Ticks delta_ticks = TICKS - SERIAL.sync_ticks;

    if (UNLIKELY(SERIAL.transferring &&
                 SERIAL.clock == SERIAL_CLOCK_INTERNAL)) {
      Ticks cpu_tick = e->state.cpu_tick;
      for (; delta_ticks > 0; delta_ticks -= cpu_tick) {
        SERIAL.tick_count += cpu_tick;
        if (VALUE_WRAPPED(SERIAL.tick_count, SERIAL_TICKS)) {
          /* Since we're never connected to another device, always shift in
           * 0xff. */
          SERIAL.sb = (SERIAL.sb << 1) | 1;
          SERIAL.transferred_bits++;
          if (VALUE_WRAPPED(SERIAL.transferred_bits, 8)) {
            SERIAL.transferring = 0;
            INTR.new_if |= IF_SERIAL;
            SERIAL.sync_ticks = TICKS - delta_ticks;
            calculate_next_serial_intr(e);
          }
        } else if (UNLIKELY(SERIAL.tick_count == 0 &&
                            SERIAL.transferred_bits == 0)) {
          INTR.if_ |= (INTR.new_if & IF_SERIAL);
        }
      }
    }
    SERIAL.sync_ticks = TICKS;
  }
}